

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__horizontal_gather_4_channels_with_10_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  __m128 cs;
  __m128 c;
  __m128 tot1;
  __m128 tot0;
  float *hc;
  float *decode;
  float *output;
  float *output_end;
  float *pfStack_480;
  int coefficient_width_local;
  float *horizontal_coefficients_local;
  stbir__contributors *horizontal_contributors_local;
  float *decode_buffer_local;
  uint output_sub_size_local;
  float *output_buffer_local;
  float fStack_324;
  float local_318;
  float fStack_2fc;
  float fStack_2f0;
  float fStack_2e4;
  float local_2d8;
  float fStack_2bc;
  float fStack_2b0;
  float fStack_2a4;
  float local_298;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  
  decode = output_buffer;
  pfStack_480 = horizontal_coefficients;
  horizontal_coefficients_local = (float *)horizontal_contributors;
  do {
    pfVar1 = decode_buffer + ((int)*horizontal_coefficients_local << 2);
    local_298 = (float)*(undefined8 *)pfStack_480;
    local_168 = (float)*(undefined8 *)pfVar1;
    fStack_164 = (float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
    fStack_160 = (float)*(undefined8 *)(pfVar1 + 2);
    fStack_15c = (float)((ulong)*(undefined8 *)(pfVar1 + 2) >> 0x20);
    fStack_2a4 = (float)((ulong)*(undefined8 *)pfStack_480 >> 0x20);
    local_188 = (float)*(undefined8 *)(pfVar1 + 4);
    fStack_184 = (float)((ulong)*(undefined8 *)(pfVar1 + 4) >> 0x20);
    fStack_180 = (float)*(undefined8 *)(pfVar1 + 6);
    fStack_17c = (float)((ulong)*(undefined8 *)(pfVar1 + 6) >> 0x20);
    fStack_2b0 = (float)*(undefined8 *)(pfStack_480 + 2);
    local_1a8 = (float)*(undefined8 *)(pfVar1 + 8);
    fStack_1a4 = (float)((ulong)*(undefined8 *)(pfVar1 + 8) >> 0x20);
    fStack_1a0 = (float)*(undefined8 *)(pfVar1 + 10);
    fStack_19c = (float)((ulong)*(undefined8 *)(pfVar1 + 10) >> 0x20);
    fStack_2bc = (float)((ulong)*(undefined8 *)(pfStack_480 + 2) >> 0x20);
    local_1c8 = (float)*(undefined8 *)(pfVar1 + 0xc);
    fStack_1c4 = (float)((ulong)*(undefined8 *)(pfVar1 + 0xc) >> 0x20);
    fStack_1c0 = (float)*(undefined8 *)(pfVar1 + 0xe);
    fStack_1bc = (float)((ulong)*(undefined8 *)(pfVar1 + 0xe) >> 0x20);
    local_2d8 = (float)*(undefined8 *)(pfStack_480 + 4);
    local_1e8 = (float)*(undefined8 *)(pfVar1 + 0x10);
    fStack_1e4 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x10) >> 0x20);
    fStack_1e0 = (float)*(undefined8 *)(pfVar1 + 0x12);
    fStack_1dc = (float)((ulong)*(undefined8 *)(pfVar1 + 0x12) >> 0x20);
    fStack_2e4 = (float)((ulong)*(undefined8 *)(pfStack_480 + 4) >> 0x20);
    local_208 = (float)*(undefined8 *)(pfVar1 + 0x14);
    fStack_204 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x14) >> 0x20);
    fStack_200 = (float)*(undefined8 *)(pfVar1 + 0x16);
    fStack_1fc = (float)((ulong)*(undefined8 *)(pfVar1 + 0x16) >> 0x20);
    fStack_2f0 = (float)*(undefined8 *)(pfStack_480 + 6);
    local_228 = (float)*(undefined8 *)(pfVar1 + 0x18);
    fStack_224 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x18) >> 0x20);
    fStack_220 = (float)*(undefined8 *)(pfVar1 + 0x1a);
    fStack_21c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x1a) >> 0x20);
    fStack_2fc = (float)((ulong)*(undefined8 *)(pfStack_480 + 6) >> 0x20);
    local_248 = (float)*(undefined8 *)(pfVar1 + 0x1c);
    fStack_244 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x1c) >> 0x20);
    fStack_240 = (float)*(undefined8 *)(pfVar1 + 0x1e);
    fStack_23c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x1e) >> 0x20);
    local_318 = (float)*(undefined8 *)(pfStack_480 + 8);
    local_268 = (float)*(undefined8 *)(pfVar1 + 0x20);
    fStack_264 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x20) >> 0x20);
    fStack_260 = (float)*(undefined8 *)(pfVar1 + 0x22);
    fStack_25c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x22) >> 0x20);
    fStack_324 = (float)((ulong)*(undefined8 *)(pfStack_480 + 8) >> 0x20);
    local_288 = (float)*(undefined8 *)(pfVar1 + 0x24);
    fStack_284 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x24) >> 0x20);
    fStack_280 = (float)*(undefined8 *)(pfVar1 + 0x26);
    fStack_27c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x26) >> 0x20);
    *(ulong *)decode =
         CONCAT44(local_298 * fStack_164 + fStack_2b0 * fStack_1a4 + local_2d8 * fStack_1e4 +
                  fStack_2f0 * fStack_224 + local_318 * fStack_264 +
                  fStack_2a4 * fStack_184 + fStack_2bc * fStack_1c4 + fStack_2e4 * fStack_204 +
                  fStack_2fc * fStack_244 + fStack_324 * fStack_284,
                  local_298 * local_168 + fStack_2b0 * local_1a8 + local_2d8 * local_1e8 +
                  fStack_2f0 * local_228 + local_318 * local_268 +
                  fStack_2a4 * local_188 + fStack_2bc * local_1c8 + fStack_2e4 * local_208 +
                  fStack_2fc * local_248 + fStack_324 * local_288);
    *(ulong *)(decode + 2) =
         CONCAT44(local_298 * fStack_15c + fStack_2b0 * fStack_19c + local_2d8 * fStack_1dc +
                  fStack_2f0 * fStack_21c + local_318 * fStack_25c +
                  fStack_2a4 * fStack_17c + fStack_2bc * fStack_1bc + fStack_2e4 * fStack_1fc +
                  fStack_2fc * fStack_23c + fStack_324 * fStack_27c,
                  local_298 * fStack_160 + fStack_2b0 * fStack_1a0 + local_2d8 * fStack_1e0 +
                  fStack_2f0 * fStack_220 + local_318 * fStack_260 +
                  fStack_2a4 * fStack_180 + fStack_2bc * fStack_1c0 + fStack_2e4 * fStack_200 +
                  fStack_2fc * fStack_240 + fStack_324 * fStack_280);
    pfStack_480 = pfStack_480 + coefficient_width;
    horizontal_coefficients_local = horizontal_coefficients_local + 2;
    decode = decode + 4;
  } while (decode < output_buffer + (output_sub_size << 2));
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_10_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__4_coeff_start();
    stbir__4_coeff_continue_from_4(4);
    stbir__2_coeff_remnant(8);
    stbir__store_output();
  } while ( output < output_end );
}